

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDsd.c
# Opt level: O0

void Ivy_DecSetVar(Ivy_Dec_t *pNode,int iNum,uint Var)

{
  uint Var_local;
  int iNum_local;
  Ivy_Dec_t *pNode_local;
  
  if ((-1 < iNum) && (iNum < 6)) {
    switch(iNum) {
    case 0:
      *pNode = (Ivy_Dec_t)((uint)*pNode & 0xfffff0ff | (Var & 0xf) << 8);
      break;
    case 1:
      *pNode = (Ivy_Dec_t)((uint)*pNode & 0xffff0fff | (Var & 0xf) << 0xc);
      break;
    case 2:
      *pNode = (Ivy_Dec_t)((uint)*pNode & 0xfff0ffff | (Var & 0xf) << 0x10);
      break;
    case 3:
      *pNode = (Ivy_Dec_t)((uint)*pNode & 0xff0fffff | (Var & 0xf) << 0x14);
      break;
    case 4:
      *pNode = (Ivy_Dec_t)((uint)*pNode & 0xf0ffffff | (Var & 0xf) << 0x18);
      break;
    case 5:
      *pNode = (Ivy_Dec_t)((uint)*pNode & 0xfffffff | Var << 0x1c);
    }
    return;
  }
  __assert_fail("iNum >= 0 && iNum <= 5",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyDsd.c"
                ,0x76,"void Ivy_DecSetVar(Ivy_Dec_t *, int, unsigned int)");
}

Assistant:

static inline void       Ivy_DecSetVar( Ivy_Dec_t * pNode, int iNum, unsigned Var )
{
    assert( iNum >= 0 && iNum <= 5 );
    switch( iNum )
    {
        case 0: pNode->Fan0 = Var; break;
        case 1: pNode->Fan1 = Var; break;
        case 2: pNode->Fan2 = Var; break;
        case 3: pNode->Fan3 = Var; break;
        case 4: pNode->Fan4 = Var; break;
        case 5: pNode->Fan5 = Var; break;
    }
}